

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

int UTF_j8_cmp(UTF_C8 *j8a,UTF_C8 *j8b)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar3 = 0xffffffff;
  while( true ) {
    cVar1 = j8a[lVar4];
    cVar2 = j8b[lVar4];
    if ((cVar1 == '\0') || (cVar2 == '\0')) {
      if (cVar2 <= cVar1) {
        uVar3 = (uint)(cVar2 < cVar1);
      }
      return uVar3;
    }
    if (cVar1 < cVar2) {
      return -1;
    }
    if (cVar2 < cVar1) break;
    lVar4 = lVar4 + 1;
  }
  return 1;
}

Assistant:

static __inline int
UTF_j8_cmp(const UTF_C8 *j8a, const UTF_C8 *j8b)
{
    while (*j8a && *j8b)
    {
        if (*j8a < *j8b) return -1;
        if (*j8a > *j8b) return 1;
        ++j8a;
        ++j8b;
    }
    if (*j8a < *j8b) return -1;
    if (*j8a > *j8b) return 1;
    return 0;
}